

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int extraout_EAX;
  secp256k1_fe *psVar44;
  secp256k1_fe *psVar45;
  long lVar46;
  ulong uVar47;
  byte bVar48;
  int iVar49;
  int iVar50;
  secp256k1_modinv64_modinfo *unaff_RBX;
  secp256k1_modinv64_modinfo *psVar51;
  secp256k1_fe *psVar52;
  ulong uVar53;
  code *unaff_RBP;
  int iVar54;
  ulong uVar55;
  uint64_t *puVar56;
  uint64_t *puVar57;
  secp256k1_fe *psVar58;
  ulong uVar59;
  int iVar60;
  secp256k1_fe *psVar61;
  uint uVar62;
  secp256k1_modinv64_modinfo *unaff_R12;
  secp256k1_fe *unaff_R13;
  ulong uVar63;
  secp256k1_fe *psVar64;
  secp256k1_fe *psVar65;
  ulong unaff_R14;
  ulong uVar66;
  secp256k1_fe *unaff_R15;
  secp256k1_fe *psVar67;
  ulong uVar68;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  uchar auStack_198 [32];
  secp256k1_fe *psStack_178;
  secp256k1_modinv64_modinfo *psStack_170;
  secp256k1_fe *psStack_168;
  ulong uStack_160;
  secp256k1_fe *psStack_158;
  secp256k1_fe *psStack_148;
  ulong uStack_140;
  ulong uStack_138;
  ulong uStack_130;
  secp256k1_fe sStack_128;
  secp256k1_modinv64_modinfo *psStack_f8;
  secp256k1_modinv64_modinfo *psStack_f0;
  secp256k1_fe *psStack_e8;
  ulong uStack_e0;
  secp256k1_fe *psStack_d8;
  code *pcStack_d0;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_modinv64_modinfo *local_68;
  ulong local_60;
  ulong local_58;
  secp256k1_modinv64_trans2x2 local_50;
  
  psVar64 = &local_c8;
  psVar65 = &local_c8;
  local_98.n[4] = (modinfo->modulus).v[4];
  psVar67 = (secp256k1_fe *)(modinfo->modulus).v[0];
  local_98.n[1] = (modinfo->modulus).v[1];
  local_98.n[2] = (modinfo->modulus).v[2];
  local_98.n[3] = (modinfo->modulus).v[3];
  local_c8.n[0] = x->v[0];
  local_c8.n[1] = x->v[1];
  local_c8.n[2] = x->v[2];
  local_c8.n[3] = x->v[3];
  local_c8.n[4] = x->v[4];
  local_98.n[0] = (uint64_t)psVar67;
  if (((((long)local_c8.n[0] < 0) || ((long)local_c8.n[1] < 0)) ||
      (unaff_RBX = modinfo, (long)local_c8.n[2] < 0)) ||
     ((x = (secp256k1_modinv64_signed62 *)local_c8.n[3], (long)local_c8.n[3] < 0 ||
      ((long)local_c8.n[4] < 0)))) {
LAB_0015284a:
    pcStack_d0 = (code *)0x15284f;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else if (((local_c8.n[2] != 0 || (secp256k1_fe *)local_c8.n[3] != (secp256k1_fe *)0x0) ||
           (local_c8.n[1] != 0 || local_c8.n[0] != 0)) || local_c8.n[4] != 0) {
    unaff_R14 = 5;
    unaff_RBP = (code *)0xffffffffffffffff;
    local_60 = 0;
    psVar51 = (secp256k1_modinv64_modinfo *)0x0;
    local_68 = modinfo;
    do {
      unaff_RBX = local_68;
      x = (secp256k1_modinv64_signed62 *)(local_98.n[1] << 0x3e | (ulong)psVar67);
      puVar56 = (uint64_t *)(local_c8.n[1] << 0x3e | local_c8.n[0]);
      psVar44 = (secp256k1_fe *)0x0;
      uVar59 = 0;
      psVar67 = (secp256k1_fe *)0x1;
      iVar50 = 0x3e;
      uVar66 = 1;
      puVar57 = puVar56;
      psVar61 = (secp256k1_fe *)x;
      while( true ) {
        uVar55 = -1L << ((byte)iVar50 & 0x3f) | (ulong)puVar57;
        lVar46 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
          }
        }
        bVar48 = (byte)lVar46;
        psVar58 = (secp256k1_fe *)((ulong)puVar57 >> (bVar48 & 0x3f));
        uVar66 = uVar66 << (bVar48 & 0x3f);
        psVar44 = (secp256k1_fe *)((long)psVar44 << (bVar48 & 0x3f));
        unaff_RBP = unaff_RBP + -lVar46;
        uVar62 = ((uint)((ulong)psVar61 >> 1) ^ (uint)((ulong)psVar61 >> 2)) & (uint)lVar46 ^
                 (uint)psVar51;
        unaff_R12 = (secp256k1_modinv64_modinfo *)(ulong)uVar62;
        iVar50 = iVar50 - (uint)lVar46;
        local_58 = unaff_R14;
        if (iVar50 == 0) break;
        if (((ulong)psVar61 & 1) == 0) {
          pcStack_d0 = (code *)0x1527ff;
          secp256k1_jacobi64_maybe_var_cold_7();
LAB_001527ff:
          pcStack_d0 = (code *)0x152804;
          secp256k1_jacobi64_maybe_var_cold_6();
LAB_00152804:
          pcStack_d0 = (code *)0x152809;
          secp256k1_jacobi64_maybe_var_cold_1();
LAB_00152809:
          pcStack_d0 = (code *)0x15280e;
          secp256k1_jacobi64_maybe_var_cold_2();
          goto LAB_0015280e;
        }
        if (((ulong)psVar58 & 1) == 0) goto LAB_001527ff;
        bVar48 = 0x3e - (char)iVar50;
        psVar51 = (secp256k1_modinv64_modinfo *)((long)psVar61 << (bVar48 & 0x3f));
        if ((secp256k1_modinv64_modinfo *)((long)psVar44 * (long)puVar56 + uVar66 * (long)x) !=
            psVar51) goto LAB_00152804;
        psVar51 = (secp256k1_modinv64_modinfo *)((long)psVar67 * (long)puVar56 + uVar59 * (long)x);
        if (psVar51 != (secp256k1_modinv64_modinfo *)((long)psVar58 << (bVar48 & 0x3f)))
        goto LAB_00152809;
        iVar60 = (int)psVar61;
        iVar54 = (int)psVar58;
        if ((long)unaff_RBP < 0) {
          unaff_RBP = (code *)-(long)unaff_RBP;
          iVar49 = (int)unaff_RBP + 1;
          if (iVar50 <= iVar49) {
            iVar49 = iVar50;
          }
          if (0xffffffc1 < iVar49 - 0x3fU) {
            psVar51 = (secp256k1_modinv64_modinfo *)
                      (ulong)(uVar62 ^ (uint)(((ulong)psVar58 & (ulong)psVar61) >> 1));
            uVar63 = (ulong)(0x3fL << (-(char)iVar49 & 0x3fU)) >> (-(char)iVar49 & 0x3fU);
            uVar62 = (iVar54 * iVar54 + 0x3e) * iVar54 * iVar60 & (uint)uVar63;
            psVar45 = psVar44;
            psVar44 = psVar67;
            psVar52 = psVar58;
            uVar55 = uVar66;
            uVar66 = uVar59;
            goto LAB_001525f7;
          }
          goto LAB_00152818;
        }
        iVar49 = (int)unaff_RBP + 1;
        if (iVar50 <= iVar49) {
          iVar49 = iVar50;
        }
        if (iVar49 - 0x3fU < 0xffffffc2) goto LAB_00152813;
        uVar63 = (ulong)(0xfL << (-(char)iVar49 & 0x3fU)) >> (-(char)iVar49 & 0x3fU);
        uVar62 = -(iVar54 * ((iVar60 * 2 + 2U & 8) + iVar60)) & (uint)uVar63;
        psVar45 = psVar67;
        psVar52 = psVar61;
        uVar55 = uVar59;
        psVar61 = psVar58;
        psVar51 = unaff_R12;
LAB_001525f7:
        uVar68 = (ulong)uVar62;
        puVar57 = (uint64_t *)((long)psVar61->n + uVar68 * (long)psVar52);
        uVar59 = uVar66 * uVar68 + uVar55;
        psVar67 = (secp256k1_fe *)((long)psVar45->n + uVar68 * (long)psVar44);
        psVar61 = psVar52;
        unaff_R12 = psVar51;
        if (((ulong)puVar57 & uVar63) != 0) {
LAB_0015280e:
          pcStack_d0 = (code *)0x152813;
          secp256k1_jacobi64_maybe_var_cold_4();
LAB_00152813:
          pcStack_d0 = (code *)0x152818;
          secp256k1_jacobi64_maybe_var_cold_3();
LAB_00152818:
          pcStack_d0 = (code *)0x15281d;
          secp256k1_jacobi64_maybe_var_cold_5();
          goto LAB_0015281d;
        }
      }
      x = (secp256k1_modinv64_signed62 *)((long)psVar44 * uVar59);
      lVar46 = (long)(uVar66 * (long)psVar67) - (long)x;
      uVar55 = (ulong)((secp256k1_fe *)(uVar66 * (long)psVar67) < x);
      uVar63 = SUB168(SEXT816((long)uVar66) * SEXT816((long)psVar67),8) -
               SUB168(SEXT816((long)psVar44) * SEXT816((long)uVar59),8);
      local_50.u = uVar66;
      local_50.v = (int64_t)psVar44;
      local_50.q = uVar59;
      local_50.r = (int64_t)psVar67;
      if ((lVar46 != 0x4000000000000000 || uVar63 != uVar55) &&
         (uVar63 - uVar55 != -1 || lVar46 != -0x4000000000000000)) {
LAB_0015281d:
        pcStack_d0 = (code *)0x152822;
        secp256k1_jacobi64_maybe_var_cold_16();
        unaff_RBX = psVar51;
        unaff_R14 = uVar66;
LAB_00152822:
        pcStack_d0 = (code *)0x152827;
        secp256k1_jacobi64_maybe_var_cold_15();
LAB_00152827:
        pcStack_d0 = (code *)0x15282c;
        secp256k1_jacobi64_maybe_var_cold_14();
LAB_0015282c:
        pcStack_d0 = (code *)0x152831;
        secp256k1_jacobi64_maybe_var_cold_13();
LAB_00152831:
        pcStack_d0 = (code *)0x152836;
        secp256k1_jacobi64_maybe_var_cold_12();
        psVar44 = &local_c8;
LAB_00152836:
        pcStack_d0 = (code *)0x15283b;
        secp256k1_jacobi64_maybe_var_cold_11();
LAB_0015283b:
        psVar64 = psVar44;
        pcStack_d0 = (code *)0x152840;
        secp256k1_jacobi64_maybe_var_cold_10();
LAB_00152840:
        pcStack_d0 = (code *)0x152845;
        secp256k1_jacobi64_maybe_var_cold_9();
        psVar65 = psVar64;
LAB_00152845:
        pcStack_d0 = (code *)0x15284a;
        secp256k1_jacobi64_maybe_var_cold_8();
        unaff_R13 = psVar65;
        unaff_R15 = psVar67;
        goto LAB_0015284a;
      }
      psVar67 = &local_98;
      iVar54 = (int)unaff_R14;
      pcStack_d0 = (code *)0x1526a0;
      x = (secp256k1_modinv64_signed62 *)psVar67;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar67,iVar54,&local_68->modulus,0);
      if (iVar50 < 1) goto LAB_00152822;
      pcStack_d0 = (code *)0x1526bb;
      x = (secp256k1_modinv64_signed62 *)psVar67;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar67,iVar54,&unaff_RBX->modulus,1);
      if (0 < iVar50) goto LAB_00152827;
      pcStack_d0 = (code *)0x1526d3;
      x = (secp256k1_modinv64_signed62 *)&local_c8;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)&local_c8,iVar54,&unaff_RBX->modulus,0);
      if (iVar50 < 1) goto LAB_0015282c;
      pcStack_d0 = (code *)0x1526ee;
      x = (secp256k1_modinv64_signed62 *)&local_c8;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)&local_c8,iVar54,&unaff_RBX->modulus,1);
      if (-1 < iVar50) goto LAB_00152831;
      pcStack_d0 = (code *)0x152709;
      secp256k1_modinv64_update_fg_62_var
                (iVar54,(secp256k1_modinv64_signed62 *)psVar67,
                 (secp256k1_modinv64_signed62 *)&local_c8,&local_50);
      psVar67 = (secp256k1_fe *)local_98.n[0];
      if ((secp256k1_fe *)local_98.n[0] == (secp256k1_fe *)0x1) {
        if (iVar54 < 2) {
LAB_001527d9:
          return 1 - (uVar62 * 2 & 2);
        }
        uVar66 = 1;
        uVar59 = 0;
        do {
          uVar59 = uVar59 | local_98.n[uVar66];
          uVar66 = uVar66 + 1;
        } while (unaff_R14 != uVar66);
        if (uVar59 == 0) goto LAB_001527d9;
      }
      lVar46 = (long)iVar54;
      if ((-1 < lVar46 + -2 && local_c8.n[lVar46 + 5] == 0) && (&pcStack_d0)[lVar46] == (code *)0x0)
      {
        unaff_R14 = (ulong)(iVar54 - 1);
      }
      psVar44 = &local_98;
      pcStack_d0 = (code *)0x152770;
      iVar54 = (int)unaff_R14;
      x = (secp256k1_modinv64_signed62 *)psVar44;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar44,iVar54,&unaff_RBX->modulus,0);
      if (iVar50 < 1) goto LAB_00152836;
      pcStack_d0 = (code *)0x15278b;
      x = (secp256k1_modinv64_signed62 *)psVar44;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar44,iVar54,&unaff_RBX->modulus,1);
      if (0 < iVar50) goto LAB_0015283b;
      pcStack_d0 = (code *)0x1527a6;
      x = (secp256k1_modinv64_signed62 *)&local_c8;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)&local_c8,iVar54,&unaff_RBX->modulus,0);
      if (iVar50 < 1) goto LAB_00152840;
      pcStack_d0 = (code *)0x1527c1;
      x = (secp256k1_modinv64_signed62 *)&local_c8;
      iVar50 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)&local_c8,iVar54,&unaff_RBX->modulus,1);
      if (-1 < iVar50) goto LAB_00152845;
      uVar62 = (int)local_60 + 1;
      local_60 = (ulong)uVar62;
      psVar51 = unaff_R12;
      if (uVar62 == 0xc) {
        return 0;
      }
    } while( true );
  }
  pcStack_d0 = secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_158 = (secp256k1_fe *)0x15286a;
  psVar67 = (secp256k1_fe *)x;
  psStack_f8 = unaff_RBX;
  psStack_f0 = unaff_R12;
  psStack_e8 = unaff_R13;
  uStack_e0 = unaff_R14;
  psStack_d8 = unaff_R15;
  pcStack_d0 = unaff_RBP;
  secp256k1_fe_verify((secp256k1_fe *)x);
  if (((secp256k1_fe *)x)->magnitude < 9) {
    uVar66 = ((secp256k1_fe *)x)->n[0];
    uVar59 = ((secp256k1_fe *)x)->n[1];
    uVar55 = ((secp256k1_fe *)x)->n[2];
    uVar63 = ((secp256k1_fe *)x)->n[3];
    uVar68 = ((secp256k1_fe *)x)->n[4];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar66 * 2;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar63;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar59 * 2;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar55;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar68;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar68;
    uVar47 = SUB168(auVar3 * auVar23,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar47 & 0xfffffffffffff;
    auVar1 = auVar2 * auVar22 + auVar1 * auVar21 + auVar4 * ZEXT816(0x1000003d10);
    uVar53 = auVar1._0_8_;
    uStack_130 = uVar53 & 0xfffffffffffff;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar53 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar68 = uVar68 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar66;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar68;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar59 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar63;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar55;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar55;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar47 >> 0x34 | SUB168(auVar3 * auVar23,8) << 0xc;
    auVar1 = auVar5 * auVar24 + auVar37 + auVar6 * auVar25 + auVar7 * auVar26 +
             auVar8 * ZEXT816(0x1000003d10);
    uStack_138 = auVar1._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uStack_138 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_140 = (uStack_138 & 0xfffffffffffff) >> 0x30;
    uStack_138 = uStack_138 & 0xffffffffffff;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar66;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar66;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar59;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar68;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar55 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar63;
    auVar1 = auVar10 * auVar28 + auVar38 + auVar11 * auVar29;
    uVar47 = auVar1._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar47 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (uVar47 & 0xfffffffffffff) << 4 | uStack_140;
    auVar1 = auVar9 * auVar27 + ZEXT816(0x1000003d1) * auVar30;
    uVar47 = auVar1._0_8_;
    sStack_128.n[0] = uVar47 & 0xfffffffffffff;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar47 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar66 * 2;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar59;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar55;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar68;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar63;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar63;
    auVar2 = auVar13 * auVar32 + auVar40 + auVar14 * auVar33;
    uVar47 = auVar2._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar47 & 0xfffffffffffff;
    auVar1 = auVar12 * auVar31 + auVar39 + auVar15 * ZEXT816(0x1000003d10);
    uVar53 = auVar1._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar47 >> 0x34 | auVar2._8_8_ << 0xc;
    sStack_128.n[1] = uVar53 & 0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar53 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar66 * 2;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar55;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar59;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar59;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar63;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar68;
    auVar42 = auVar18 * auVar36 + auVar42;
    uVar66 = auVar42._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar66 & 0xfffffffffffff;
    auVar1 = auVar16 * auVar34 + auVar41 + auVar17 * auVar35 + auVar19 * ZEXT816(0x1000003d10);
    uVar59 = auVar1._0_8_;
    sStack_128.n[2] = uVar59 & 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (uVar59 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_130;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar66 >> 0x34 | auVar42._8_8_ << 0xc;
    auVar43 = auVar20 * ZEXT816(0x1000003d10) + auVar43;
    uVar66 = auVar43._0_8_;
    sStack_128.n[3] = uVar66 & 0xfffffffffffff;
    sStack_128.n[4] = (uVar66 >> 0x34 | auVar43._8_8_ << 0xc) + uStack_138;
    sStack_128.magnitude = 1;
    sStack_128.normalized = 0;
    psStack_158 = (secp256k1_fe *)0x152ab6;
    psStack_148 = (secp256k1_fe *)x;
    secp256k1_fe_verify(&sStack_128);
    psStack_158 = (secp256k1_fe *)0x152ac6;
    secp256k1_fe_mul(&sStack_128,&sStack_128,psStack_148);
    psStack_158 = (secp256k1_fe *)0x152ace;
    secp256k1_fe_verify(&sStack_128);
    sStack_128.n[0] = sStack_128.n[0] + 7;
    sStack_128.normalized = 0;
    sStack_128.magnitude = sStack_128.magnitude + 1;
    psStack_158 = (secp256k1_fe *)0x152ae5;
    secp256k1_fe_verify(&sStack_128);
    psStack_158 = (secp256k1_fe *)0x152aed;
    iVar50 = secp256k1_fe_is_square_var(&sStack_128);
    return iVar50;
  }
  psStack_158 = (secp256k1_fe *)random_fe_test;
  secp256k1_ge_x_on_curve_var_cold_1();
  psStack_178 = (secp256k1_fe *)x;
  psStack_170 = unaff_R12;
  psStack_168 = unaff_R13;
  uStack_160 = unaff_R14;
  psStack_158 = unaff_R15;
  while( true ) {
    secp256k1_testrand_bytes_test(auStack_198,0x20);
    secp256k1_fe_impl_set_b32_mod(psVar67,auStack_198);
    if (((psVar67->n[0] < 0xffffefffffc2f) || (psVar67->n[4] != 0xffffffffffff)) ||
       ((psVar67->n[2] & psVar67->n[3] & psVar67->n[1]) != 0xfffffffffffff)) break;
    psVar67->magnitude = -1;
  }
  psVar67->magnitude = 1;
  psVar67->normalized = 1;
  secp256k1_fe_verify(psVar67);
  return extraout_EAX;
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
#endif
        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
#endif
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}